

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vvc.cpp
# Opt level: O2

int __thiscall VvcSliceHeader::deserialize(VvcSliceHeader *this,VvcSpsUnit *sps,VvcPpsUnit *pps)

{
  BitStreamReader *this_00;
  bool bVar1;
  int iVar2;
  uint uVar3;
  
  iVar2 = VvcUnit::deserialize(&this->super_VvcUnit);
  if (iVar2 == 0) {
    this_00 = &(this->super_VvcUnit).m_reader;
    bVar1 = BitStreamReader::getBit(this_00);
    iVar2 = 0;
    if (bVar1) {
      bVar1 = BitStreamReader::getBit(this_00);
      BitStreamReader::skipBit(this_00);
      if (bVar1) {
        BitStreamReader::skipBit(this_00);
      }
      bVar1 = BitStreamReader::getBit(this_00);
      if (bVar1) {
        BitStreamReader::skipBit(this_00);
      }
      uVar3 = VvcUnit::extractUEGolombCode(&this->super_VvcUnit);
      if (uVar3 < 0x40) {
        uVar3 = BitStreamReader::getBits(this_00,(uint)sps->log2_max_pic_order_cnt_lsb);
        this->pic_order_cnt_lsb = (uint16_t)uVar3;
        iVar2 = 0;
      }
      else {
        iVar2 = 1;
      }
    }
  }
  return iVar2;
}

Assistant:

int VvcSliceHeader::deserialize(const VvcSpsUnit* sps, const VvcPpsUnit* pps)
{
    const int rez = VvcUnit::deserialize();
    if (rez)
        return rez;

    try
    {
        if (m_reader.getBit())  // sh_picture_header_in_slice_header_flag
        {
            const bool ph_gdr_or_irap_pic_flag = m_reader.getBit();
            m_reader.skipBit();  // ph_non_ref_pic_flag
            if (ph_gdr_or_irap_pic_flag)
                m_reader.skipBit();          // ph_gdr_pic_flag
            if (m_reader.getBit())           // ph_inter_slice_allowed_flag
                m_reader.skipBit();          // ph_intra_slice_allowed_flag
            if (extractUEGolombCode() > 63)  // ph_pps_id
                return 1;
            pic_order_cnt_lsb = m_reader.getBits<uint16_t>(sps->log2_max_pic_order_cnt_lsb);
        }

        return 0;
    }
    catch (VodCoreException& e)
    {
        (void)e;
        return NOT_ENOUGH_BUFFER;
    }
}